

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<TestResult_(mp::LogicalConstant)>::FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::LogicalConstant)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<TestResult_(mp::LogicalConstant)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_0029ff18;
  MockSpec<TestResult_(mp::LogicalConstant)>::MockSpec
            ((MockSpec<TestResult_(mp::LogicalConstant)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}